

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::Expression::
visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
          (Expression *this,Expression *expr,MonitorVisitor *visitor)

{
  logic_error *this_00;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(expr->kind) {
  case Invalid:
  case IntegerLiteral:
  case RealLiteral:
  case TimeLiteral:
  case UnbasedUnsizedIntegerLiteral:
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case MemberAccess:
  case DataType:
  case TypeReference:
  case HierarchicalReference:
  case LValueReference:
  case EmptyArgument:
    return;
  case NamedValue:
  case HierarchicalValue:
    builtins::MonitorVisitor::handle(visitor,(ValueExpressionBase *)expr);
    return;
  case UnaryOp:
    UnaryExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((UnaryExpression *)expr,visitor);
    return;
  case BinaryOp:
    BinaryExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((BinaryExpression *)expr,visitor);
    return;
  case ConditionalOp:
    ConditionalExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((ConditionalExpression *)expr,visitor);
    return;
  case Inside:
    InsideExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((InsideExpression *)expr,visitor);
    return;
  case Assignment:
    AssignmentExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((AssignmentExpression *)expr,visitor);
    return;
  case Concatenation:
    ConcatenationExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((ConcatenationExpression *)expr,visitor);
    return;
  case Replication:
    ReplicationExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((ReplicationExpression *)expr,visitor);
    return;
  case Streaming:
    StreamingConcatenationExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((StreamingConcatenationExpression *)expr,visitor);
    return;
  case ElementSelect:
    ElementSelectExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((ElementSelectExpression *)expr,visitor);
    return;
  case RangeSelect:
    RangeSelectExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((RangeSelectExpression *)expr,visitor);
    return;
  case Call:
    CallExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((CallExpression *)expr,visitor);
    return;
  case Conversion:
    ConversionExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((ConversionExpression *)expr,visitor);
    return;
  case SimpleAssignmentPattern:
  case StructuredAssignmentPattern:
    AssignmentPatternExpressionBase::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((AssignmentPatternExpressionBase *)expr,visitor);
    return;
  case ReplicatedAssignmentPattern:
    ReplicatedAssignmentPatternExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((ReplicatedAssignmentPatternExpression *)expr,visitor);
    return;
  case OpenRange:
    OpenRangeExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((OpenRangeExpression *)expr,visitor);
    return;
  case Dist:
    DistExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((DistExpression *)expr,visitor);
    return;
  case NewArray:
    NewArrayExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((NewArrayExpression *)expr,visitor);
    return;
  case NewClass:
    NewClassExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((NewClassExpression *)expr,visitor);
    return;
  case NewCovergroup:
    NewCovergroupExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((NewCovergroupExpression *)expr,visitor);
    return;
  case CopyClass:
    CopyClassExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((CopyClassExpression *)expr,visitor);
    return;
  case MinTypMax:
    MinTypMaxExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((MinTypMaxExpression *)expr,visitor);
    return;
  case ClockingEvent:
    ClockingEventExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((ClockingEventExpression *)expr,visitor);
    return;
  case AssertionInstance:
    AssertionInstanceExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((AssertionInstanceExpression *)expr,visitor);
    return;
  case TaggedUnion:
    TaggedUnionExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
              ((TaggedUnionExpression *)expr,visitor);
    return;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_d9);
    std::operator+(&local_98,&local_b8,":");
    std::__cxx11::to_string(&local_d8,0x15b);
    std::operator+(&local_78,&local_98,&local_d8);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

decltype(auto) Expression::visitExpression(TExpression* expr, TVisitor&& visitor,
                                           Args&&... args) const {
    // clang-format off
#define CASE(k, n) case ExpressionKind::k: return visitor.visit(\
                        *static_cast<std::conditional_t<std::is_const_v<TExpression>, const n*, n*>>(expr),\
                            std::forward<Args>(args)...)

    switch (expr->kind) {
        case ExpressionKind::Invalid: return visitor.visitInvalid(*expr, std::forward<Args>(args)...);
        CASE(IntegerLiteral, IntegerLiteral);
        CASE(RealLiteral, RealLiteral);
        CASE(TimeLiteral, TimeLiteral);
        CASE(UnbasedUnsizedIntegerLiteral, UnbasedUnsizedIntegerLiteral);
        CASE(NullLiteral, NullLiteral);
        CASE(UnboundedLiteral, UnboundedLiteral);
        CASE(StringLiteral, StringLiteral);
        CASE(NamedValue, NamedValueExpression);
        CASE(HierarchicalValue, HierarchicalValueExpression);
        CASE(UnaryOp, UnaryExpression);
        CASE(BinaryOp, BinaryExpression);
        CASE(ConditionalOp, ConditionalExpression);
        CASE(Inside, InsideExpression);
        CASE(Assignment, AssignmentExpression);
        CASE(Concatenation, ConcatenationExpression);
        CASE(Replication, ReplicationExpression);
        CASE(Streaming, StreamingConcatenationExpression);
        CASE(ElementSelect, ElementSelectExpression);
        CASE(RangeSelect, RangeSelectExpression);
        CASE(MemberAccess, MemberAccessExpression);
        CASE(Call, CallExpression);
        CASE(Conversion, ConversionExpression);
        CASE(DataType, DataTypeExpression);
        CASE(TypeReference, TypeReferenceExpression);
        CASE(HierarchicalReference, HierarchicalReferenceExpression);
        CASE(LValueReference, LValueReferenceExpression);
        CASE(SimpleAssignmentPattern, SimpleAssignmentPatternExpression);
        CASE(StructuredAssignmentPattern, StructuredAssignmentPatternExpression);
        CASE(ReplicatedAssignmentPattern, ReplicatedAssignmentPatternExpression);
        CASE(EmptyArgument, EmptyArgumentExpression);
        CASE(OpenRange, OpenRangeExpression);
        CASE(Dist, DistExpression);
        CASE(NewArray, NewArrayExpression);
        CASE(NewClass, NewClassExpression);
        CASE(NewCovergroup, NewCovergroupExpression);
        CASE(CopyClass, CopyClassExpression);
        CASE(MinTypMax, MinTypMaxExpression);
        CASE(ClockingEvent, ClockingEventExpression);
        CASE(AssertionInstance, AssertionInstanceExpression);
        CASE(TaggedUnion, TaggedUnionExpression);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}